

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::setShaderSources
          (ShaderCompilerCase *this,deUint32 vertShader,deUint32 fragShader,ProgramContext *progCtx)

{
  int iVar1;
  undefined4 extraout_var;
  char *fragShaderSourceCStr;
  char *vertShaderSourceCStr;
  pointer local_30;
  pointer local_28;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_28 = (progCtx->vertShaderSource)._M_dataplus._M_p;
  local_30 = (progCtx->fragShaderSource)._M_dataplus._M_p;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x12b8))(vertShader,1,&local_28,0);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x12b8))(fragShader,1,&local_30,0);
  return;
}

Assistant:

void ShaderCompilerCase::setShaderSources (deUint32 vertShader, deUint32 fragShader, const ProgramContext& progCtx) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	const char* vertShaderSourceCStr = progCtx.vertShaderSource.c_str();
	const char* fragShaderSourceCStr = progCtx.fragShaderSource.c_str();
	gl.shaderSource(vertShader, 1, &vertShaderSourceCStr, DE_NULL);
	gl.shaderSource(fragShader, 1, &fragShaderSourceCStr, DE_NULL);
}